

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform.cc
# Opt level: O0

void __thiscall
kratos::InterfaceInstantiationVisitor::visit
          (InterfaceInstantiationVisitor *this,Generator *generator)

{
  bool bVar1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::InterfaceRef>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::InterfaceRef>_>_>_>
  *pmVar2;
  reference __in;
  element_type *peVar3;
  bool *pbVar4;
  element_type *peVar5;
  unordered_set<kratos::AssignStmt_*,_std::hash<kratos::AssignStmt_*>,_std::equal_to<kratos::AssignStmt_*>,_std::allocator<kratos::AssignStmt_*>_>
  *this_00;
  reference ppAVar6;
  value_type *st;
  const_iterator __end3;
  const_iterator __begin3;
  unordered_set<kratos::AssignStmt_*,_std::hash<kratos::AssignStmt_*>,_std::equal_to<kratos::AssignStmt_*>,_std::allocator<kratos::AssignStmt_*>_>
  *__range3;
  shared_ptr<kratos::Stmt> local_78;
  element_type *local_68;
  undefined1 local_60 [8];
  shared_ptr<kratos::InterfaceInstantiationStmt> stmt;
  type *interface;
  type *name;
  _Self local_38;
  const_iterator __end2;
  const_iterator __begin2;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::InterfaceRef>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::InterfaceRef>_>_>_>
  *__range2;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::InterfaceRef>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::InterfaceRef>_>_>_>
  *interfaces;
  Generator *generator_local;
  InterfaceInstantiationVisitor *this_local;
  
  interfaces = (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::InterfaceRef>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::InterfaceRef>_>_>_>
                *)generator;
  generator_local = (Generator *)this;
  pmVar2 = Generator::interfaces_abi_cxx11_(generator);
  __end2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::InterfaceRef>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::InterfaceRef>_>_>_>
           ::begin(pmVar2);
  local_38._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::InterfaceRef>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::InterfaceRef>_>_>_>
       ::end(pmVar2);
  while (bVar1 = std::operator!=(&__end2,&local_38), bVar1) {
    __in = std::
           _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::InterfaceRef>_>_>
           ::operator*(&__end2);
    std::get<0ul,std::__cxx11::string_const,std::shared_ptr<kratos::InterfaceRef>>(__in);
    stmt.super___shared_ptr<kratos::InterfaceInstantiationStmt,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         std::get<1ul,std::__cxx11::string_const,std::shared_ptr<kratos::InterfaceRef>>(__in);
    peVar3 = std::
             __shared_ptr_access<kratos::InterfaceRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<kratos::InterfaceRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)stmt.
                           super___shared_ptr<kratos::InterfaceInstantiationStmt,_(__gnu_cxx::_Lock_policy)2>
                           ._M_refcount._M_pi);
    pbVar4 = InterfaceRef::has_instantiated(peVar3);
    if ((*pbVar4 & 1U) == 0) {
      peVar3 = std::
               __shared_ptr_access<kratos::InterfaceRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<kratos::InterfaceRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)stmt.
                             super___shared_ptr<kratos::InterfaceInstantiationStmt,_(__gnu_cxx::_Lock_policy)2>
                             ._M_refcount._M_pi);
      pbVar4 = InterfaceRef::is_port(peVar3);
      if ((*pbVar4 & 1U) == 0) {
        local_68 = std::__shared_ptr<kratos::InterfaceRef,_(__gnu_cxx::_Lock_policy)2>::get
                             ((__shared_ptr<kratos::InterfaceRef,_(__gnu_cxx::_Lock_policy)2> *)
                              stmt.
                              super___shared_ptr<kratos::InterfaceInstantiationStmt,_(__gnu_cxx::_Lock_policy)2>
                              ._M_refcount._M_pi);
        std::
        make_shared<kratos::InterfaceInstantiationStmt,kratos::Generator*&,kratos::InterfaceRef*>
                  ((Generator **)local_60,(InterfaceRef **)&interfaces);
        pmVar2 = interfaces;
        std::shared_ptr<kratos::Stmt>::shared_ptr<kratos::InterfaceInstantiationStmt,void>
                  (&local_78,(shared_ptr<kratos::InterfaceInstantiationStmt> *)local_60);
        Generator::add_stmt((Generator *)pmVar2,&local_78);
        std::shared_ptr<kratos::Stmt>::~shared_ptr(&local_78);
        peVar5 = std::
                 __shared_ptr_access<kratos::InterfaceInstantiationStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<kratos::InterfaceInstantiationStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)local_60);
        this_00 = InstantiationStmt::connection_stmt(&peVar5->super_InstantiationStmt);
        __end3 = std::
                 unordered_set<kratos::AssignStmt_*,_std::hash<kratos::AssignStmt_*>,_std::equal_to<kratos::AssignStmt_*>,_std::allocator<kratos::AssignStmt_*>_>
                 ::begin(this_00);
        st = (value_type *)
             std::
             unordered_set<kratos::AssignStmt_*,_std::hash<kratos::AssignStmt_*>,_std::equal_to<kratos::AssignStmt_*>,_std::allocator<kratos::AssignStmt_*>_>
             ::end(this_00);
        while (bVar1 = std::__detail::operator!=
                                 (&__end3.super__Node_iterator_base<kratos::AssignStmt_*,_false>,
                                  (_Node_iterator_base<kratos::AssignStmt_*,_false> *)&st), bVar1) {
          ppAVar6 = std::__detail::_Node_const_iterator<kratos::AssignStmt_*,_true,_false>::
                    operator*(&__end3);
          (*((*ppAVar6)->super_Stmt).super_IRNode._vptr_IRNode[9])();
          std::__detail::_Node_const_iterator<kratos::AssignStmt_*,_true,_false>::operator++
                    (&__end3);
        }
        std::shared_ptr<kratos::InterfaceInstantiationStmt>::~shared_ptr
                  ((shared_ptr<kratos::InterfaceInstantiationStmt> *)local_60);
      }
    }
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::InterfaceRef>_>_>
    ::operator++(&__end2);
  }
  return;
}

Assistant:

void visit(Generator* generator) override {
        const auto& interfaces = generator->interfaces();
        for (auto const& [name, interface] : interfaces) {
            if (interface->has_instantiated()) continue;
            if (interface->is_port()) continue;
            auto stmt = std::make_shared<InterfaceInstantiationStmt>(generator, interface.get());
            generator->add_stmt(stmt);

            // remove the stmts that's fold into the instantiation statement
            for (auto const& st : stmt->connection_stmt()) {
                st->remove_from_parent();
            }
        }
    }